

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

int nni_copyin_size(size_t *sp,void *v,size_t sz,size_t minv,size_t maxv,nni_type t)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 0x1e;
  if (t == NNI_TYPE_SIZE) {
    uVar1 = *v;
    iVar2 = 3;
    if (minv <= uVar1 && uVar1 <= maxv) {
      *sp = uVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
nni_copyin_size(
    size_t *sp, const void *v, size_t sz, size_t minv, size_t maxv, nni_type t)
{
	size_t val;
	NNI_ARG_UNUSED(sz);

	if (t != NNI_TYPE_SIZE) {
		return (NNG_EBADTYPE);
	}

	val = *(size_t *) v;
	if ((val > maxv) || (val < minv)) {
		return (NNG_EINVAL);
	}
	*sp = val;
	return (0);
}